

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewind.c
# Opt level: O2

void decode_rle(u8 *src,size_t src_size,u8 *dst,u8 *dst_end)

{
  u8 uVar1;
  u32 uVar2;
  int iVar3;
  u8 uVar4;
  u8 *puVar5;
  u8 *puVar6;
  bool bVar7;
  u8 *local_30;
  
  if (src_size == 0) {
    __assert_fail("src_size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/rewind.c",
                  0xa9,"void decode_rle(const u8 *, size_t, u8 *, u8 *)");
  }
  uVar4 = *src;
  *dst = uVar4;
  puVar6 = dst + 1;
  puVar5 = src + 1;
  while (puVar5 < src + src_size) {
    local_30 = puVar5 + 1;
    uVar1 = *puVar5;
    if (uVar1 == uVar4) {
      uVar2 = read_varint(&local_30);
      iVar3 = uVar2 + 1;
      while (bVar7 = iVar3 != 0, iVar3 = iVar3 + -1, puVar5 = local_30, bVar7) {
        *puVar6 = uVar4;
        puVar6 = puVar6 + 1;
      }
    }
    else {
      *puVar6 = uVar1;
      puVar6 = puVar6 + 1;
      puVar5 = local_30;
      uVar4 = uVar1;
    }
  }
  if (puVar6 != dst_end) {
    __assert_fail("dst == dst_end",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/rewind.c",
                  0xab,"void decode_rle(const u8 *, size_t, u8 *, u8 *)");
  }
  return;
}

Assistant:

static void decode_rle(const u8* src, size_t src_size, u8* dst, u8* dst_end) {
#define WRITE(x) *dst++ = (x)
  DECODE_RLE(WRITE, src, src_size);
#undef WRITE
  assert(dst == dst_end);
}